

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O0

void __thiscall
optimization::graph_color::Graph_Color::optimize_mir
          (Graph_Color *this,MirPackage *package,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  bool bVar1;
  pointer ppVar2;
  allocator<char> *__rhs;
  any *in_RDX;
  allocator<char> *in_RDI;
  iterator iter;
  MirFunction *in_stack_00001190;
  string *in_stack_00001198;
  Graph_Color *in_stack_000011a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
  *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>_>_>_>_>
  *in_stack_ffffffffffffff48;
  any *in_stack_ffffffffffffff50;
  key_type *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string local_48 [32];
  _Self local_28;
  _Self local_20;
  any *local_18;
  
  local_18 = in_RDX;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
       ::begin(in_stack_ffffffffffffff38);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>_>
         ::end(in_stack_ffffffffffffff38);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                           *)0x1a4e8e);
    std::__cxx11::string::string(local_48,(string *)ppVar2);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)0x1a4ead);
    optimize_func(in_stack_000011a0,in_stack_00001198,in_stack_00001190);
    std::__cxx11::string::~string(local_48);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mir::inst::MirFunction>_>
                  *)in_stack_ffffffffffffff48,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::any::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  __rhs = in_RDI + 0xa0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78,in_RDI);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::any::operator=(local_18,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>
                                *)__rhs);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
  return;
}

Assistant:

void optimize_mir(mir::inst::MirPackage& package,
                    std::map<std::string, std::any>& extra_data_repo) {
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         iter++) {
      optimize_func(iter->first, iter->second);
    }
    extra_data_repo[name] = func_color_map;
    extra_data_repo["unused_colors"] = func_unused_colors;
  }